

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_buffered_stream.c
# Opt level: O3

void test_write_one_buffer_partial_write_error_at_element_boundary(void)

{
  cio_buffered_stream *buffered_stream;
  int iVar1;
  cio_error cVar2;
  memory_stream *ms;
  cio_write_buffer wb3;
  undefined1 local_98 [24];
  undefined8 local_80;
  cio_write_buffer local_78;
  undefined1 local_58 [24];
  undefined8 local_40;
  cio_write_buffer local_38;
  
  ms = (memory_stream *)malloc(0x100);
  local_78.prev = (cio_write_buffer *)local_58;
  local_58._16_8_ = "Hello";
  local_40 = 5;
  local_98._8_8_ = &local_78;
  local_78.data.head.q_len = (long)"MYHelloWorld" + 7;
  local_78.data.element.length = 5;
  local_98._16_8_ = "foo";
  local_80 = 3;
  local_38.data.head.q_len = 3;
  local_38.data.element.length = 0xd;
  local_98._0_8_ = &local_38;
  local_78.next = (cio_write_buffer *)local_98;
  local_58._0_8_ = local_98._8_8_;
  local_58._8_8_ = &local_38;
  local_38.next = local_78.prev;
  local_38.prev = (cio_write_buffer *)local_98;
  iVar1 = memory_stream_init(ms,"");
  UnityAssertEqualNumber
            (0,(long)iVar1,"Could not allocate memory for test!",0x692,UNITY_DISPLAY_STYLE_INT);
  write_some_fake.custom_fake = write_some_first_write_partial_at_element_boundary_second_error;
  buffered_stream = (cio_buffered_stream *)(ms + 1);
  cVar2 = cio_buffered_stream_init(buffered_stream,(cio_io_stream *)ms);
  UnityAssertEqualNumber
            (0,(long)cVar2,"Buffer was not initialized correctly!",0x696,UNITY_DISPLAY_STYLE_INT);
  cVar2 = cio_buffered_stream_write(buffered_stream,&local_38,dummy_write_handler,(void *)0x0);
  UnityAssertEqualNumber(0,(long)cVar2,"Return value not correct!",0x698,UNITY_DISPLAY_STYLE_INT);
  cVar2 = cio_buffered_stream_close(buffered_stream);
  UnityAssertEqualNumber(0,(long)cVar2,"Return value not correct!",0x69b,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)close_fake.call_count,"Underlying cio_iostream was not closed!",0x69c,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)dummy_write_handler_fake.call_count,"Handler was not called!",0x69d,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (-0x5a,(long)dummy_write_handler_fake.arg2_val,
             "Handler was not called with CIO_MESSAGE_TOO_LONG!",0x69e,UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_write_one_buffer_partial_write_error_at_element_boundary(void)
{
	static const char *test_data1 = "Hello";
	static const char *test_data2 = "World";
	static const char *test_data3 = "foo";

	struct client *client = malloc(sizeof(*client));

	struct cio_write_buffer wbh;
	cio_write_buffer_head_init(&wbh);
	struct cio_write_buffer wb1;
	cio_write_buffer_const_element_init(&wb1, test_data1, strlen(test_data1));
	cio_write_buffer_queue_tail(&wbh, &wb1);

	struct cio_write_buffer wb2;
	cio_write_buffer_const_element_init(&wb2, test_data2, strlen(test_data2));
	cio_write_buffer_queue_tail(&wbh, &wb2);

	struct cio_write_buffer wb3;
	cio_write_buffer_const_element_init(&wb3, test_data3, strlen(test_data3));
	cio_write_buffer_queue_tail(&wbh, &wb3);

	TEST_ASSERT_EQUAL_INT_MESSAGE(0, memory_stream_init(&client->ms, ""), "Could not allocate memory for test!");
	write_some_fake.custom_fake = write_some_first_write_partial_at_element_boundary_second_error;

	enum cio_error err = cio_buffered_stream_init(&client->bs, &client->ms.ios);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Buffer was not initialized correctly!");
	err = cio_buffered_stream_write(&client->bs, &wbh, dummy_write_handler, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Return value not correct!");

	err = cio_buffered_stream_close(&client->bs);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Return value not correct!");
	TEST_ASSERT_EQUAL_MESSAGE(1, close_fake.call_count, "Underlying cio_iostream was not closed!");
	TEST_ASSERT_EQUAL_MESSAGE(1, dummy_write_handler_fake.call_count, "Handler was not called!");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_MESSAGE_TOO_LONG, dummy_write_handler_fake.arg2_val, "Handler was not called with CIO_MESSAGE_TOO_LONG!");
}